

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

SUNErrCode N_VConstVectorArray_ManyVector(int nvec,sunrealtype c,N_Vector *Z)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  
  __ptr = malloc((long)nvec * 8);
  if (0 < *(*Z)->content) {
    lVar2 = 0;
    do {
      if (0 < nvec) {
        lVar1 = 0;
        do {
          *(undefined8 *)((long)__ptr + lVar1 * 8) =
               *(undefined8 *)(*(long *)((long)Z[lVar1]->content + 0x10) + lVar2 * 8);
          lVar1 = lVar1 + 1;
        } while (nvec != lVar1);
      }
      N_VConstVectorArray(c,nvec,__ptr);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(*Z)->content);
  }
  free(__ptr);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VConstVectorArray)(int nvec, sunrealtype c, N_Vector* Z)
{
  SUNFunctionBegin(Z[0]->sunctx);
  sunindextype i, j;
  N_Vector* Zsub;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* create array of N_Vector pointers for reuse within loop */
  Zsub = NULL;
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VConstVectorArray for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(Z[0]); i++)
  {
    /* for each subvector, create the array of subvectors of X, Y and Z */
    for (j = 0; j < nvec; j++) { Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i); }

    /* now call N_VConstVectorArray for this array of subvectors */
    SUNCheckCall(N_VConstVectorArray(nvec, c, Zsub));
  }

  /* clean up and return */
  free(Zsub);
  return SUN_SUCCESS;
}